

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileBlockManager::Initialize
          (SingleFileBlockManager *this,DatabaseHeader *header,optional_idx block_alloc_size)

{
  optional_idx *this_00;
  pointer pcVar1;
  long lVar2;
  idx_t iVar3;
  InvalidInputException *pIVar4;
  StorageManager *pSVar5;
  ulong uVar6;
  string local_d0;
  ulong local_b0;
  optional_idx local_a0;
  optional_idx local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->free_list_id = header->free_list;
  this->meta_block = header->meta_block;
  this->iteration_count = header->iteration;
  local_a0.index = block_alloc_size.index;
  lVar2 = NumericCastImpl<long,_unsigned_long,_false>::Convert(header->block_count);
  this->max_block = lVar2;
  this_00 = &(this->options).storage_version;
  if ((this->options).storage_version.index == 0xffffffffffffffff) {
    optional_idx::optional_idx((optional_idx *)&local_d0,header->serialization_compatibility);
    this_00->index = (idx_t)local_d0._M_dataplus._M_p;
    uVar6 = header->serialization_compatibility;
  }
  else {
    iVar3 = optional_idx::GetIndex(this_00);
    uVar6 = header->serialization_compatibility;
    if (iVar3 < uVar6) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "Error opening \"%s\": cannot initialize database with storage version %d - which is lower than what the database itself uses (%d). The storage version of an existing database cannot be lowered."
                 ,"");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (this->path)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (this->path)._M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
                (pIVar4,&local_d0,&local_50,iVar3,header->serialization_compatibility);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  SerializationCompatibility::Latest();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (uVar6 <= local_b0) {
    pSVar5 = AttachedDatabase::GetStorageManager(this->db);
    iVar3 = optional_idx::GetIndex(this_00);
    optional_idx::optional_idx((optional_idx *)&local_d0,iVar3);
    (pSVar5->storage_version).index = (idx_t)local_d0._M_dataplus._M_p;
    if (block_alloc_size.index == 0xffffffffffffffff) {
      iVar3 = header->block_alloc_size;
    }
    else {
      iVar3 = optional_idx::GetIndex(&local_a0);
      if (iVar3 != header->block_alloc_size) {
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "Error opening \"%s\": cannot initialize the same database with a different block size: provided block size: %llu, file block size: %llu"
                   ,"");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar1 = (this->path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + (this->path)._M_string_length);
        iVar3 = optional_idx::GetIndex(&(this->super_BlockManager).block_alloc_size);
        InvalidInputException::
        InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
                  (pIVar4,&local_d0,&local_90,iVar3,header->block_alloc_size);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    optional_idx::optional_idx(&local_98,iVar3);
    BlockManager::SetBlockAllocSize(&this->super_BlockManager,local_98);
    return;
  }
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Error opening \"%s\": file was written with a storage version greater than the latest version supported by this DuckDB instance. Try opening the file with a newer version of DuckDB."
             ,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->path)._M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar4,&local_d0,&local_70);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::Initialize(const DatabaseHeader &header, const optional_idx block_alloc_size) {
	free_list_id = header.free_list;
	meta_block = header.meta_block;
	iteration_count = header.iteration;
	max_block = NumericCast<block_id_t>(header.block_count);
	if (options.storage_version.IsValid()) {
		// storage version specified explicity - use requested storage version
		auto requested_compat_version = options.storage_version.GetIndex();
		if (requested_compat_version < header.serialization_compatibility) {
			throw InvalidInputException(
			    "Error opening \"%s\": cannot initialize database with storage version %d - which is lower than what "
			    "the database itself uses (%d). The storage version of an existing database cannot be lowered.",
			    path, requested_compat_version, header.serialization_compatibility);
		}
	} else {
		// load storage version from header
		options.storage_version = header.serialization_compatibility;
	}
	if (header.serialization_compatibility > SerializationCompatibility::Latest().serialization_version) {
		throw InvalidInputException(
		    "Error opening \"%s\": file was written with a storage version greater than the latest version supported "
		    "by this DuckDB instance. Try opening the file with a newer version of DuckDB.",
		    path);
	}

	db.GetStorageManager().SetStorageVersion(options.storage_version.GetIndex());

	if (block_alloc_size.IsValid() && block_alloc_size.GetIndex() != header.block_alloc_size) {
		throw InvalidInputException(
		    "Error opening \"%s\": cannot initialize the same database with a different block size: provided block "
		    "size: %llu, file block size: %llu",
		    path, GetBlockAllocSize(), header.block_alloc_size);
	}

	SetBlockAllocSize(header.block_alloc_size);
}